

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash.c
# Opt level: O0

PCryptoHash * p_crypto_hash_new(PCryptoHashType type)

{
  ppointer pvVar1;
  bool local_21;
  PCryptoHash *ret;
  PCryptoHash *pPStack_10;
  PCryptoHashType type_local;
  
  local_21 = type < (P_CRYPTO_HASH_TYPE_GOST|P_CRYPTO_HASH_TYPE_SHA1);
  if (local_21) {
    pPStack_10 = (PCryptoHash *)p_malloc0(0x48);
    if (pPStack_10 == (PCryptoHash *)0x0) {
      printf("** Error: %s **\n","PCryptoHash::p_crypto_hash_new: failed to allocate memory");
      pPStack_10 = (PCryptoHash *)0x0;
    }
    else {
      switch(type) {
      case P_CRYPTO_HASH_TYPE_MD5:
        pPStack_10->create = p_crypto_hash_md5_new;
        pPStack_10->update = p_crypto_hash_md5_update;
        pPStack_10->finish = p_crypto_hash_md5_finish;
        pPStack_10->digest = p_crypto_hash_md5_digest;
        pPStack_10->reset = p_crypto_hash_md5_reset;
        pPStack_10->free = p_crypto_hash_md5_free;
        pPStack_10->hash_len = 0x10;
        break;
      case P_CRYPTO_HASH_TYPE_SHA1:
        pPStack_10->create = p_crypto_hash_sha1_new;
        pPStack_10->update = p_crypto_hash_sha1_update;
        pPStack_10->finish = p_crypto_hash_sha1_finish;
        pPStack_10->digest = p_crypto_hash_sha1_digest;
        pPStack_10->reset = p_crypto_hash_sha1_reset;
        pPStack_10->free = p_crypto_hash_sha1_free;
        pPStack_10->hash_len = 0x14;
        break;
      case P_CRYPTO_HASH_TYPE_SHA2_224:
        pPStack_10->create = p_crypto_hash_sha2_224_new;
        pPStack_10->update = p_crypto_hash_sha2_256_update;
        pPStack_10->finish = p_crypto_hash_sha2_256_finish;
        pPStack_10->digest = p_crypto_hash_sha2_256_digest;
        pPStack_10->reset = p_crypto_hash_sha2_256_reset;
        pPStack_10->free = p_crypto_hash_sha2_256_free;
        pPStack_10->hash_len = 0x1c;
        break;
      case P_CRYPTO_HASH_TYPE_SHA2_256:
        pPStack_10->create = p_crypto_hash_sha2_256_new;
        pPStack_10->update = p_crypto_hash_sha2_256_update;
        pPStack_10->finish = p_crypto_hash_sha2_256_finish;
        pPStack_10->digest = p_crypto_hash_sha2_256_digest;
        pPStack_10->reset = p_crypto_hash_sha2_256_reset;
        pPStack_10->free = p_crypto_hash_sha2_256_free;
        pPStack_10->hash_len = 0x20;
        break;
      case P_CRYPTO_HASH_TYPE_SHA2_384:
        pPStack_10->create = p_crypto_hash_sha2_384_new;
        pPStack_10->update = p_crypto_hash_sha2_512_update;
        pPStack_10->finish = p_crypto_hash_sha2_512_finish;
        pPStack_10->digest = p_crypto_hash_sha2_512_digest;
        pPStack_10->reset = p_crypto_hash_sha2_512_reset;
        pPStack_10->free = p_crypto_hash_sha2_512_free;
        pPStack_10->hash_len = 0x30;
        break;
      case P_CRYPTO_HASH_TYPE_SHA2_512:
        pPStack_10->create = p_crypto_hash_sha2_512_new;
        pPStack_10->update = p_crypto_hash_sha2_512_update;
        pPStack_10->finish = p_crypto_hash_sha2_512_finish;
        pPStack_10->digest = p_crypto_hash_sha2_512_digest;
        pPStack_10->reset = p_crypto_hash_sha2_512_reset;
        pPStack_10->free = p_crypto_hash_sha2_512_free;
        pPStack_10->hash_len = 0x40;
        break;
      case P_CRYPTO_HASH_TYPE_SHA3_224:
        pPStack_10->create = p_crypto_hash_sha3_224_new;
        pPStack_10->update = p_crypto_hash_sha3_update;
        pPStack_10->finish = p_crypto_hash_sha3_finish;
        pPStack_10->digest = p_crypto_hash_sha3_digest;
        pPStack_10->reset = p_crypto_hash_sha3_reset;
        pPStack_10->free = p_crypto_hash_sha3_free;
        pPStack_10->hash_len = 0x1c;
        break;
      case P_CRYPTO_HASH_TYPE_SHA3_256:
        pPStack_10->create = p_crypto_hash_sha3_256_new;
        pPStack_10->update = p_crypto_hash_sha3_update;
        pPStack_10->finish = p_crypto_hash_sha3_finish;
        pPStack_10->digest = p_crypto_hash_sha3_digest;
        pPStack_10->reset = p_crypto_hash_sha3_reset;
        pPStack_10->free = p_crypto_hash_sha3_free;
        pPStack_10->hash_len = 0x20;
        break;
      case P_CRYPTO_HASH_TYPE_SHA3_384:
        pPStack_10->create = p_crypto_hash_sha3_384_new;
        pPStack_10->update = p_crypto_hash_sha3_update;
        pPStack_10->finish = p_crypto_hash_sha3_finish;
        pPStack_10->digest = p_crypto_hash_sha3_digest;
        pPStack_10->reset = p_crypto_hash_sha3_reset;
        pPStack_10->free = p_crypto_hash_sha3_free;
        pPStack_10->hash_len = 0x30;
        break;
      case P_CRYPTO_HASH_TYPE_SHA3_512:
        pPStack_10->create = p_crypto_hash_sha3_512_new;
        pPStack_10->update = p_crypto_hash_sha3_update;
        pPStack_10->finish = p_crypto_hash_sha3_finish;
        pPStack_10->digest = p_crypto_hash_sha3_digest;
        pPStack_10->reset = p_crypto_hash_sha3_reset;
        pPStack_10->free = p_crypto_hash_sha3_free;
        pPStack_10->hash_len = 0x40;
        break;
      case P_CRYPTO_HASH_TYPE_GOST:
        pPStack_10->create = p_crypto_hash_gost3411_new;
        pPStack_10->update = p_crypto_hash_gost3411_update;
        pPStack_10->finish = p_crypto_hash_gost3411_finish;
        pPStack_10->digest = p_crypto_hash_gost3411_digest;
        pPStack_10->reset = p_crypto_hash_gost3411_reset;
        pPStack_10->free = p_crypto_hash_gost3411_free;
        pPStack_10->hash_len = 0x20;
      }
      pPStack_10->type = type;
      pPStack_10->closed = 0;
      pvVar1 = (*pPStack_10->create)();
      pPStack_10->context = pvVar1;
      if (pvVar1 == (ppointer)0x0) {
        p_free(pPStack_10);
        pPStack_10 = (PCryptoHash *)0x0;
      }
    }
  }
  else {
    pPStack_10 = (PCryptoHash *)0x0;
  }
  return pPStack_10;
}

Assistant:

P_LIB_API PCryptoHash *
p_crypto_hash_new (PCryptoHashType type)
{
	PCryptoHash *ret;

	if (P_UNLIKELY (!((int) type >= (int) P_CRYPTO_HASH_TYPE_MD5 &&
			  (int) type <= (int) P_CRYPTO_HASH_TYPE_GOST)))
		return NULL;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PCryptoHash))) == NULL)) {
		P_ERROR ("PCryptoHash::p_crypto_hash_new: failed to allocate memory");
		return NULL;
	}

	switch (type) {
	case P_CRYPTO_HASH_TYPE_MD5:
		P_HASH_FUNCS (ret, md5)
		ret->hash_len = 16;
		break;
	case P_CRYPTO_HASH_TYPE_SHA1:
		P_HASH_FUNCS (ret, sha1)
		ret->hash_len = 20;
		break;
	case P_CRYPTO_HASH_TYPE_SHA2_224:
		P_HASH_FUNCS (ret, sha2_224)
		ret->hash_len = 28;
		break;
	case P_CRYPTO_HASH_TYPE_SHA2_256:
		P_HASH_FUNCS (ret, sha2_256)
		ret->hash_len = 32;
		break;
	case P_CRYPTO_HASH_TYPE_SHA2_384:
		P_HASH_FUNCS (ret, sha2_384)
		ret->hash_len = 48;
		break;
	case P_CRYPTO_HASH_TYPE_SHA2_512:
		P_HASH_FUNCS (ret, sha2_512)
		ret->hash_len = 64;
		break;
	case P_CRYPTO_HASH_TYPE_SHA3_224:
		P_HASH_FUNCS (ret, sha3_224)
		ret->hash_len = 28;
		break;
	case P_CRYPTO_HASH_TYPE_SHA3_256:
		P_HASH_FUNCS (ret, sha3_256)
		ret->hash_len = 32;
		break;
	case P_CRYPTO_HASH_TYPE_SHA3_384:
		P_HASH_FUNCS (ret, sha3_384)
		ret->hash_len = 48;
		break;
	case P_CRYPTO_HASH_TYPE_SHA3_512:
		P_HASH_FUNCS (ret, sha3_512)
		ret->hash_len = 64;
		break;
	case P_CRYPTO_HASH_TYPE_GOST:
		P_HASH_FUNCS (ret, gost3411)
		ret->hash_len = 32;
		break;
	}

	ret->type   = type;
	ret->closed = FALSE;

	if (P_UNLIKELY ((ret->context = ret->create ()) == NULL)) {
		p_free (ret);
		return NULL;
	}

	return ret;
}